

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraph.cc
# Opt level: O1

void __thiscall
SequenceDistanceGraph::load_from_gfa2(SequenceDistanceGraph *this,ifstream *gfaf,ifstream *fastaf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  iterator iVar8;
  sgNodeID_t sVar9;
  mapped_type *pmVar10;
  istream *piVar11;
  logic_error *this_00;
  long *plVar12;
  size_type *psVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_01;
  int32_t dist;
  string gfa_source;
  string gfa_dest;
  uint source_end;
  uint source_beg;
  string line;
  string gfa_destdir;
  string gfa_sourcedir;
  string gfa_rtype;
  string seq;
  string name;
  string id;
  string gfa_length;
  string gfa_star;
  string gfa_cigar;
  uint dest_end;
  uint dest_beg;
  istringstream iss;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  gap_dist;
  long *local_508;
  long local_500;
  long local_4f8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_4e8;
  int32_t local_4dc;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_4d8;
  key_type local_4d0;
  key_type local_4b0;
  int local_490;
  int local_48c;
  char *local_488;
  ulong local_480;
  char local_478;
  undefined7 uStack_477;
  undefined1 *local_468;
  ulong local_460;
  undefined1 local_458;
  undefined7 uStack_457;
  undefined1 *local_448;
  ulong local_440;
  undefined1 local_438;
  undefined7 uStack_437;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  long *local_408;
  char *local_400;
  long local_3f8 [2];
  ifstream *local_3e8;
  key_type local_3e0;
  undefined1 *local_3c0;
  undefined8 local_3b8;
  undefined1 local_3b0;
  undefined7 uStack_3af;
  undefined1 *local_3a0;
  undefined8 local_398;
  undefined1 local_390;
  undefined7 uStack_38f;
  undefined1 *local_380;
  undefined8 local_378;
  undefined1 local_370;
  undefined7 uStack_36f;
  undefined1 *local_360;
  undefined8 local_358;
  undefined1 local_350;
  undefined7 uStack_34f;
  Node local_340;
  Node local_300;
  Node local_2c8;
  Node local_290;
  Node local_258;
  Node local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8 [3];
  ios_base local_170 [264];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_488 = &local_478;
  local_480 = 0;
  local_478 = '\0';
  poVar7 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Graph fasta filename: ",0x16);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->fasta_filename)._M_dataplus._M_p,
                      (this->fasta_filename)._M_string_length);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  poVar7 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Loading sequences from ",0x17);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->fasta_filename)._M_dataplus._M_p,
                      (this->fasta_filename)._M_string_length);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  local_3e0._M_string_length = 0;
  local_3e0.field_2._M_local_buf[0] = '\0';
  local_408 = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"");
  std::__cxx11::string::reserve((ulong)&local_408);
  this_01 = &(this->oldnames_to_ids)._M_h;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(this_01);
  paVar1 = &local_1e8[0].field_2;
  local_1e8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"");
  local_4e8 = &this->oldnames;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_4e8,
             local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8[0]._M_dataplus._M_p,local_1e8[0].field_2._M_allocated_capacity + 1);
  }
  std::vector<Node,_std::allocator<Node>_>::_M_erase_at_end
            (&this->nodes,
             (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  ::_M_erase_at_end(&(this->super_DistanceGraph).links,
                    (this->super_DistanceGraph).links.
                    super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_1e8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"");
  paVar2 = &local_220.sequence.field_2;
  local_220.sequence._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_220,local_1e8[0]._M_dataplus._M_p,
             local_1e8[0]._M_dataplus._M_p + local_1e8[0]._M_string_length);
  local_220.status = Deleted;
  local_220.support.type = Undefined;
  local_220.support.index = 0;
  local_220.support.id = 0;
  add_node(this,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.sequence._M_dataplus._M_p != paVar2) {
    operator_delete(local_220.sequence._M_dataplus._M_p,
                    local_220.sequence.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8[0]._M_dataplus._M_p,local_1e8[0].field_2._M_allocated_capacity + 1);
  }
  lVar14 = *(long *)(*(long *)fastaf + -0x18);
  if (((byte)fastaf[lVar14 + 0x20] & 2) == 0) {
    local_4d8 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)0x0;
    do {
      cVar4 = std::ios::widen((char)lVar14 + (char)fastaf);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)fastaf,(string *)&local_488,cVar4);
      if ((((byte)fastaf[*(long *)(*(long *)fastaf + -0x18) + 0x20] & 2) == 0) &&
         (*local_488 != '>')) {
        std::__cxx11::string::_M_append((char *)&local_408,(ulong)local_488);
      }
      else {
        if (local_3e0._M_string_length != 0) {
          iVar8 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(this_01,&local_3e0);
          if (iVar8.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
              ._M_cur != (__node_type *)0x0) {
            this_00 = (logic_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_428,"sequence ",&local_3e0);
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_428);
            local_1e8[0]._M_dataplus._M_p = (pointer)*plVar12;
            psVar13 = (size_type *)(plVar12 + 2);
            if ((size_type *)local_1e8[0]._M_dataplus._M_p == psVar13) {
              local_1e8[0].field_2._0_8_ = *psVar13;
              local_1e8[0].field_2._8_8_ = plVar12[3];
              local_1e8[0]._M_dataplus._M_p = (pointer)&local_1e8[0].field_2;
            }
            else {
              local_1e8[0].field_2._0_8_ = *psVar13;
            }
            local_1e8[0]._M_string_length = plVar12[1];
            *plVar12 = (long)psVar13;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            std::logic_error::logic_error(this_00,(string *)local_1e8);
            __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          local_340.sequence._M_dataplus._M_p = (pointer)&local_340.sequence.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_340,local_408,local_400 + (long)local_408);
          local_340.status = Active;
          local_340.support.type = Undefined;
          local_340.support.index = 0;
          local_340.support.id = 0;
          sVar9 = add_node(this,&local_340);
          pmVar10 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_01,&local_3e0);
          *pmVar10 = sVar9;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340.sequence._M_dataplus._M_p != &local_340.sequence.field_2) {
            operator_delete(local_340.sequence._M_dataplus._M_p,
                            local_340.sequence.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_4e8,&local_3e0);
          bVar5 = Node::is_canonical((this->nodes).super__Vector_base<Node,_std::allocator<Node>_>.
                                     _M_impl.super__Vector_impl_data._M_finish + -1);
          if (!bVar5) {
            Node::make_rc((this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                          super__Vector_impl_data._M_finish + -1);
            pmVar10 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)this_01,&local_3e0);
            lVar14 = *pmVar10;
            pmVar10 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)this_01,&local_3e0);
            *pmVar10 = -lVar14;
            local_4d8 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)((long)local_4d8 + 1);
          }
        }
        local_3e0._M_string_length = 0;
        *local_3e0._M_dataplus._M_p = '\0';
        if (1 < local_480) {
          uVar16 = 1;
          do {
            if (local_488[uVar16] == ' ') break;
            std::__cxx11::string::push_back((char)&local_3e0);
            uVar16 = uVar16 + 1;
          } while (uVar16 < local_480);
        }
        std::__cxx11::string::_M_replace((ulong)&local_408,0,local_400,0x225908);
      }
      lVar14 = *(long *)(*(long *)fastaf + -0x18);
    } while (((byte)fastaf[lVar14 + 0x20] & 2) == 0);
  }
  else {
    local_4d8 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)0x0;
  }
  poVar7 = sdglib::OutputLog(INFO,true);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," nodes loaded (",0xf);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," canonised).",0xc);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  local_428._M_string_length = 0;
  local_428.field_2._M_local_buf[0] = '\0';
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  local_4d0._M_string_length = 0;
  local_4d0.field_2._M_local_buf[0] = '\0';
  local_448 = &local_438;
  local_440 = 0;
  local_438 = 0;
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  local_4b0._M_string_length = 0;
  local_4b0.field_2._M_local_buf[0] = '\0';
  local_468 = &local_458;
  local_460 = 0;
  local_458 = 0;
  local_360 = &local_350;
  local_358 = 0;
  local_350 = 0;
  local_380 = &local_370;
  local_378 = 0;
  local_370 = 0;
  local_3a0 = &local_390;
  local_398 = 0;
  local_390 = 0;
  local_3c0 = &local_3b0;
  local_3b8 = 0;
  local_3b0 = 0;
  local_4e8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0;
  uVar16 = 0;
  local_4d8 = this_01;
  local_3e8 = gfaf;
  while( true ) {
    cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)gfaf + -0x18) + (char)gfaf);
    piVar11 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)gfaf,(string *)&local_488,cVar4);
    if ((((byte)piVar11[*(long *)(*(long *)piVar11 + -0x18) + 0x20] & 5) != 0) ||
       (((byte)((istream *)gfaf)[*(long *)(*(long *)gfaf + -0x18) + 0x20] & 2) != 0)) break;
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1e8,(string *)&local_488,_S_in);
    std::operator>>((istream *)local_1e8,(string *)&local_428);
    iVar6 = std::__cxx11::string::compare((char *)&local_428);
    if (iVar6 == 0) {
      std::operator>>((istream *)local_1e8,(string *)&local_4d0);
      std::operator>>((istream *)local_1e8,(string *)&local_3a0);
      std::operator>>((istream *)local_1e8,(string *)&local_380);
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)&local_428);
      if (iVar6 == 0) {
        std::operator>>((istream *)local_1e8,(string *)&local_3c0);
        std::operator>>((istream *)local_1e8,(string *)&local_4d0);
        std::operator>>((istream *)local_1e8,(string *)&local_4b0);
        std::istream::_M_extract<unsigned_int>((uint *)local_1e8);
        std::istream::_M_extract<unsigned_int>((uint *)local_1e8);
        std::istream::_M_extract<unsigned_int>((uint *)local_1e8);
        std::istream::_M_extract<unsigned_int>((uint *)local_1e8);
        std::operator>>((istream *)local_1e8,(string *)&local_360);
        local_4dc = local_48c - local_490;
        std::__cxx11::string::_M_replace_aux((ulong)&local_448,0,local_440,'\x01');
        std::__cxx11::string::pop_back();
        std::__cxx11::string::_M_replace_aux((ulong)&local_468,0,local_460,'\x01');
        std::__cxx11::string::pop_back();
        iVar8 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(this_01,&local_4d0);
        if (iVar8.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_508 = local_4f8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"");
          local_258.sequence._M_dataplus._M_p = (pointer)&local_258.sequence.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_258,local_508,local_500 + (long)local_508);
          local_258.status = Active;
          local_258.support.type = Undefined;
          local_258.support.index = 0;
          local_258.support.id = 0;
          sVar9 = add_node(this,&local_258);
          pmVar10 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_01,&local_4d0);
          *pmVar10 = sVar9;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258.sequence._M_dataplus._M_p != &local_258.sequence.field_2) {
            operator_delete(local_258.sequence._M_dataplus._M_p,
                            local_258.sequence.field_2._M_allocated_capacity + 1);
          }
          if (local_508 != local_4f8) {
            operator_delete(local_508,local_4f8[0] + 1);
          }
        }
        iVar8 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(this_01,&local_4b0);
        if (iVar8.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_508 = local_4f8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"");
          local_290.sequence._M_dataplus._M_p = (pointer)&local_290.sequence.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_290,local_508,local_500 + (long)local_508);
          local_290.status = Active;
          local_290.support.type = Undefined;
          local_290.support.index = 0;
          local_290.support.id = 0;
          sVar9 = add_node(this,&local_290);
          pmVar10 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_01,&local_4b0);
          *pmVar10 = sVar9;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290.sequence._M_dataplus._M_p != &local_290.sequence.field_2) {
            operator_delete(local_290.sequence._M_dataplus._M_p,
                            local_290.sequence.field_2._M_allocated_capacity + 1);
          }
          if (local_508 != local_4f8) {
            operator_delete(local_508,local_4f8[0] + 1);
          }
        }
        pmVar10 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_01,&local_4d0);
        lVar14 = *pmVar10;
        pmVar10 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_01,&local_4b0);
        lVar3 = *pmVar10;
        iVar6 = std::__cxx11::string::compare((char *)&local_448);
        lVar15 = -lVar14;
        if (iVar6 != 0) {
          lVar15 = lVar14;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_468);
        gfaf = local_3e8;
        this_01 = local_4d8;
        lVar14 = -lVar3;
        if (iVar6 != 0) {
          lVar14 = lVar3;
        }
        DistanceGraph::add_link
                  (&this->super_DistanceGraph,lVar15,lVar14,local_4dc,(Support)ZEXT816(0));
        local_4e8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)local_4e8 + 1);
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)&local_428);
        if (iVar6 == 0) {
          std::operator>>((istream *)local_1e8,(string *)&local_3c0);
          std::operator>>((istream *)local_1e8,(string *)&local_4d0);
          std::operator>>((istream *)local_1e8,(string *)&local_4b0);
          std::istream::operator>>((istream *)local_1e8,&local_4dc);
          std::__cxx11::string::_M_replace_aux((ulong)&local_448,0,local_440,'\x01');
          std::__cxx11::string::pop_back();
          std::__cxx11::string::_M_replace_aux((ulong)&local_468,0,local_460,'\x01');
          std::__cxx11::string::pop_back();
          iVar8 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(this_01,&local_4d0);
          if (iVar8.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
              ._M_cur == (__node_type *)0x0) {
            local_508 = local_4f8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"");
            local_2c8.sequence._M_dataplus._M_p = (pointer)&local_2c8.sequence.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2c8,local_508,local_500 + (long)local_508);
            local_2c8.status = Active;
            local_2c8.support.type = Undefined;
            local_2c8.support.index = 0;
            local_2c8.support.id = 0;
            sVar9 = add_node(this,&local_2c8);
            pmVar10 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)this_01,&local_4d0);
            *pmVar10 = sVar9;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8.sequence._M_dataplus._M_p != &local_2c8.sequence.field_2) {
              operator_delete(local_2c8.sequence._M_dataplus._M_p,
                              local_2c8.sequence.field_2._M_allocated_capacity + 1);
            }
            if (local_508 != local_4f8) {
              operator_delete(local_508,local_4f8[0] + 1);
            }
          }
          iVar8 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(this_01,&local_4b0);
          if (iVar8.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
              ._M_cur == (__node_type *)0x0) {
            local_508 = local_4f8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"");
            local_300.sequence._M_dataplus._M_p = (pointer)&local_300.sequence.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_300,local_508,local_500 + (long)local_508);
            local_300.status = Active;
            local_300.support.type = Undefined;
            local_300.support.index = 0;
            local_300.support.id = 0;
            sVar9 = add_node(this,&local_300);
            pmVar10 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)this_01,&local_4b0);
            *pmVar10 = sVar9;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_300.sequence._M_dataplus._M_p != &local_300.sequence.field_2) {
              operator_delete(local_300.sequence._M_dataplus._M_p,
                              local_300.sequence.field_2._M_allocated_capacity + 1);
            }
            if (local_508 != local_4f8) {
              operator_delete(local_508,local_4f8[0] + 1);
            }
          }
          pmVar10 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_01,&local_4d0);
          lVar14 = *pmVar10;
          pmVar10 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_01,&local_4b0);
          lVar3 = *pmVar10;
          iVar6 = std::__cxx11::string::compare((char *)&local_448);
          lVar15 = -lVar14;
          if (iVar6 != 0) {
            lVar15 = lVar14;
          }
          iVar6 = std::__cxx11::string::compare((char *)&local_468);
          gfaf = local_3e8;
          this_01 = local_4d8;
          lVar14 = -lVar3;
          if (iVar6 != 0) {
            lVar14 = lVar3;
          }
          DistanceGraph::add_link
                    (&this->super_DistanceGraph,lVar15,lVar14,local_4dc,(Support)ZEXT816(0));
          uVar16 = uVar16 + 1;
        }
      }
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1e8);
    std::ios_base::~ios_base(local_170);
  }
  if ((float)local_4e8 * 0.5 < (float)uVar16) {
    poVar7 = sdglib::OutputLog(WARN,true);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"Warning: The loaded graph contains ",0x23);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," non-overlapping links out of ",0x1e)
    ;
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  poVar7 = sdglib::OutputLog(INFO,true);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," nodes after connecting with ",0x1d);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," links.",7);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0,CONCAT71(uStack_3af,local_3b0) + 1);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0,CONCAT71(uStack_38f,local_390) + 1);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380,CONCAT71(uStack_36f,local_370) + 1);
  }
  if (local_360 != &local_350) {
    operator_delete(local_360,CONCAT71(uStack_34f,local_350) + 1);
  }
  if (local_468 != &local_458) {
    operator_delete(local_468,CONCAT71(uStack_457,local_458) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,
                    CONCAT71(local_4b0.field_2._M_allocated_capacity._1_7_,
                             local_4b0.field_2._M_local_buf[0]) + 1);
  }
  if (local_448 != &local_438) {
    operator_delete(local_448,CONCAT71(uStack_437,local_438) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,
                    CONCAT71(local_4d0.field_2._M_allocated_capacity._1_7_,
                             local_4d0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,
                    CONCAT71(local_428.field_2._M_allocated_capacity._1_7_,
                             local_428.field_2._M_local_buf[0]) + 1);
  }
  if (local_408 != local_3f8) {
    operator_delete(local_408,local_3f8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,
                    CONCAT71(local_3e0.field_2._M_allocated_capacity._1_7_,
                             local_3e0.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  if (local_488 != &local_478) {
    operator_delete(local_488,CONCAT71(uStack_477,local_478) + 1);
  }
  return;
}

Assistant:

void SequenceDistanceGraph::load_from_gfa2(std::ifstream &gfaf, std::ifstream &fastaf) {
    std::string line;
    sdglib::OutputLog(sdglib::LogLevels::INFO) << "Graph fasta filename: " << fasta_filename << std::endl;
    //load all sequences from fasta file if they're not canonical, flip and remember they're flipped
    sdglib::OutputLog(sdglib::LogLevels::INFO) << "Loading sequences from " << fasta_filename << std::endl;

    std::unordered_map<std::string, unsigned int> gap_dist;
    std::string name, seq = "";
    seq.reserve(10000000); //stupid hack but probably useful to reserve
    oldnames_to_ids.clear();
    oldnames.push_back("");
    nodes.clear();
    links.clear();
    add_node(Node("",NodeStatus::Deleted)); //an empty deleted node on 0, just to skip the space
    sgNodeID_t nextid=1;
    uint64_t rcnodes=0;
    while(!fastaf.eof()){
        std::getline(fastaf,line);
        if (fastaf.eof() or line[0] == '>'){

            if (!name.empty()) {
                //rough ansi C and C++ mix but it works
                if (oldnames_to_ids.find(name) != oldnames_to_ids.end())
                    throw std::logic_error("sequence " + name + " is already defined");
                oldnames_to_ids[name] = add_node(Node(seq));
                oldnames.push_back(name);
                //reverse seq if not canonical
                if (!nodes.back().is_canonical()) {
                    nodes.back().make_rc();
                    oldnames_to_ids[name] = -oldnames_to_ids[name];
                    ++rcnodes;
                }
            }

            // Clear the name and set name to the new name, this is a new sequence!
            name.clear();
            for (auto i = 1; i < line.size() and line[i] != ' '; ++i) name += line[i];
            seq = "";
        } else {
            seq += line;

        }
    }
    sdglib::OutputLog(sdglib::LogLevels::INFO) << nodes.size()-1 << " nodes loaded (" << rcnodes << " canonised)." << std::endl;

    //load store all connections.

    std::string gfa_rtype,gfa_source,gfa_sourcedir,gfa_dest,gfa_destdir,gfa_cigar,gfa_star,gfa_length,id;
    unsigned int source_beg,source_end,dest_beg,dest_end;
    sgNodeID_t src_id,dest_id;
    int32_t dist;
    uint64_t lcount=0;
    uint64_t dist_egt0(0);
    while(std::getline(gfaf, line) and !gfaf.eof()) {
        std::istringstream iss(line);
        iss >> gfa_rtype;

        if (gfa_rtype == "S") {
            iss >> gfa_source;
            iss >> gfa_length;
            iss >> gfa_star;

            // The length of a sequence reported by GFA2 isn't required to match the actual length of the sequence
            /*
            if (oldnames_to_ids.find(gfa_source) != oldnames_to_ids.end()) {
                if (std::stoi(gfa_length.substr(5)) !=
                    nodes[std::abs(oldnames_to_ids[gfa_source])].sequence.length()) {
                    throw std::logic_error(
                            "Different length in node and fasta for sequence: " + gfa_source + " -> gfa:" +
                            gfa_length.substr(5) + ", fasta: " +
                            std::to_string(nodes[oldnames_to_ids[gfa_source]].sequence.length()));
                }
            }*/

        } else if (gfa_rtype == "E") {
            iss >> id;
            iss >> gfa_source;
            iss >> gfa_dest;
            iss >> source_beg;
            iss >> source_end;
            iss >> dest_beg;
            iss >> dest_end;
            iss >> gfa_cigar;

            dist =  -1 * (source_end - source_beg);
            gfa_sourcedir = gfa_source.back();
            gfa_source.pop_back();
            gfa_destdir = gfa_dest.back();
            gfa_dest.pop_back();

            //std::cout<<"'"<<source<<"' '"<<gfa_sourcedir<<"' '"<<dest<<"' '"<<destdir<<"'"<<std::endl;
            if (oldnames_to_ids.find(gfa_source) == oldnames_to_ids.end()) {
                oldnames_to_ids[gfa_source] = add_node(Node(""));
                //std::cout<<"added source!" <<source<<std::endl;
            }
            if (oldnames_to_ids.find(gfa_dest) == oldnames_to_ids.end()) {
                oldnames_to_ids[gfa_dest] = add_node(Node(""));
                //std::cout<<"added dest! "<<dest<<std::endl;
            }

            src_id=oldnames_to_ids[gfa_source];
            dest_id=oldnames_to_ids[gfa_dest];

            //Go from GFA's "Links as paths" to a normal "nodes have sinks (-/start/left) and sources (+/end/right)
            if (gfa_sourcedir == "+") src_id=-src_id;
            if (gfa_destdir == "-") dest_id=-dest_id;

            add_link(src_id,dest_id,dist);
            ++lcount;
        } else if (gfa_rtype == "G") {
            iss >> id;
            iss >> gfa_source;
            iss >> gfa_dest;
            iss >> dist;

            gfa_sourcedir = gfa_source.back();
            gfa_source.pop_back();
            gfa_destdir = gfa_dest.back();
            gfa_dest.pop_back();

            //std::cout<<"'"<<source<<"' '"<<gfa_sourcedir<<"' '"<<dest<<"' '"<<destdir<<"'"<<std::endl;
            if (oldnames_to_ids.find(gfa_source) == oldnames_to_ids.end()) {
                oldnames_to_ids[gfa_source] = add_node(Node(""));
                //std::cout<<"added source!" <<source<<std::endl;
            }
            if (oldnames_to_ids.find(gfa_dest) == oldnames_to_ids.end()) {
                oldnames_to_ids[gfa_dest] = add_node(Node(""));
                //std::cout<<"added dest! "<<dest<<std::endl;
            }

            src_id=oldnames_to_ids[gfa_source];
            dest_id=oldnames_to_ids[gfa_dest];

            //Go from GFA's "Links as paths" to a normal "nodes have sinks (-/start/left) and sources (+/end/right)
            if (gfa_sourcedir == "+") src_id=-src_id;
            if (gfa_destdir == "-") dest_id=-dest_id;

            add_link(src_id,dest_id,dist);

            dist_egt0++;
        }
    }
    if (dist_egt0 > lcount*0.5f) {
        sdglib::OutputLog(sdglib::LogLevels::WARN) << "Warning: The loaded graph contains " << dist_egt0 << " non-overlapping links out of " << lcount << std::endl;
    }
    sdglib::OutputLog(sdglib::LogLevels::INFO) << nodes.size() - 1 << " nodes after connecting with " << lcount << " links." << std::endl;

}